

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

void __thiscall
jaegertracing::Span::Span
          (Span *this,shared_ptr<const_jaegertracing::Tracer> *tracer,SpanContext *context,
          string *operationName,time_point *startTimeSystem,time_point *startTimeSteady,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,
          vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  *(undefined **)this = &std::bad_alloc::vtable;
  *(element_type **)(this + 8) =
       (tracer->super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (tracer->super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  SpanContext::SpanContext((SpanContext *)(this + 0x18),context);
  *(Span **)(this + 200) = this + 0xd8;
  pcVar2 = (operationName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 200),pcVar2,pcVar2 + operationName->_M_string_length);
  *(rep *)(this + 0xe8) = (startTimeSystem->__d).__r;
  *(rep *)(this + 0xf0) = (startTimeSteady->__d).__r;
  *(undefined8 *)(this + 0xf8) = 0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x100),tags)
  ;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x130),references);
  *(undefined8 *)(this + 0x158) = 0;
  *(undefined8 *)(this + 0x160) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x168) = 0;
  return;
}

Assistant:

explicit Span(
        const std::shared_ptr<const Tracer>& tracer = nullptr,
        const SpanContext& context = SpanContext(),
        const std::string& operationName = "",
        const SystemClock::time_point& startTimeSystem = SystemClock::now(),
        const SteadyClock::time_point& startTimeSteady = SteadyClock::now(),
        const std::vector<Tag>& tags = {},
        const std::vector<Reference>& references = {})
        : _tracer(tracer)
        , _context(context)
        , _operationName(operationName)
        , _startTimeSystem(startTimeSystem)
        , _startTimeSteady(startTimeSteady)
        , _duration()
        , _tags(tags)
        , _references(references)
    {
    }